

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cpp
# Opt level: O2

string * rightJustifyZero_abi_cxx11_(string *__return_storage_ptr__,int input,int width)

{
  ostream *this;
  stringstream s;
  long local_190 [2];
  long alStack_180 [45];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&s);
  *(long *)((long)alStack_180 + *(long *)(local_190[0] + -0x18)) = (long)width;
  this = std::operator<<(local_190,0x30);
  std::ostream::operator<<(this,input);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string rightJustifyZero (const int input, const int width)
{
  std::stringstream s;
  s << std::setw (width) << std::setfill ('0') << input;
  return s.str ();
}